

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O1

string * jsonnet::internal::jsonnet_unlex(string *__return_storage_ptr__,Tokens *tokens)

{
  int iVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  char cVar4;
  string *psVar5;
  char cVar6;
  ostream *poVar7;
  long lVar8;
  _List_node_base *p_Var9;
  char *pcVar10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *line;
  _List_node_base *p_Var11;
  stringstream ss;
  char local_1d1;
  _List_node_base *local_1d0;
  string *local_1c8;
  _List_node_base *local_1c0;
  stringstream local_1b8 [16];
  ostream local_1a8 [112];
  ios_base local_138 [264];
  
  local_1c8 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1b8);
  local_1c0 = (_List_node_base *)tokens;
  do {
    p_Var11 = (((_List_base<jsonnet::internal::Token,_std::allocator<jsonnet::internal::Token>_> *)
               &((_List_node_base *)tokens)->_M_next)->_M_impl)._M_node.super__List_node_base.
              _M_next;
    if (p_Var11 == local_1c0) break;
    p_Var2 = p_Var11[2]._M_next;
    local_1d0 = p_Var11;
    for (p_Var9 = p_Var11[1]._M_prev; p_Var9 != p_Var2;
        p_Var9 = (_List_node_base *)&p_Var9[2]._M_prev) {
      iVar1 = *(int *)&p_Var9->_M_next;
      if (iVar1 == 2) {
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Paragraph(\n",0xb);
        p_Var3 = p_Var9[1]._M_prev;
        for (p_Var11 = p_Var9[1]._M_next; p_Var11 != p_Var3; p_Var11 = p_Var11 + 2) {
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"    ",4);
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (local_1a8,(char *)p_Var11->_M_next,(long)p_Var11->_M_prev);
          local_1d1 = '\n';
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_1d1,1);
        }
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,")",1);
        poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
        lVar8 = 1;
        pcVar10 = "\n";
LAB_00167284:
        std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar10,lVar8);
      }
      else {
        if (iVar1 == 1) {
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Interstitial(",0xd);
          poVar7 = local_1a8;
LAB_001671d7:
          poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar7,(char *)(p_Var9[1]._M_next)->_M_next,
                              (long)(p_Var9[1]._M_next)->_M_prev);
LAB_001671e9:
          lVar8 = 2;
          pcVar10 = ")\n";
          goto LAB_00167284;
        }
        if (iVar1 == 0) {
          if (p_Var9[1]._M_prev != p_Var9[1]._M_next) {
            std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"LineEnd(",8);
            poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
            poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
            std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
            goto LAB_001671d7;
          }
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"LineEnd(",8);
          poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7,", ",2);
          poVar7 = std::ostream::_M_insert<unsigned_long>((ulong)poVar7);
          goto LAB_001671e9;
        }
      }
    }
    iVar1 = *(int *)&local_1d0[1]._M_next;
    lVar8 = 4;
    if (iVar1 == 0x24) {
      pcVar10 = "EOF\n";
      poVar7 = local_1a8;
    }
    else if (iVar1 == 0xf) {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"|||\n",4);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_1a8,(char *)local_1d0[5]._M_next,(long)local_1d0[5]._M_prev);
      p_Var11 = local_1d0[3]._M_next;
      cVar6 = *(char *)&(local_1d0[3]._M_next)->_M_next;
      cVar4 = local_1d1;
      while (local_1d1 = cVar6, local_1d1 != '\0') {
        p_Var9 = (_List_node_base *)((long)&p_Var11->_M_next + 1);
        std::__ostream_insert<char,std::char_traits<char>>(local_1a8,&local_1d1,1);
        if (((*(char *)&p_Var11->_M_next == '\n') && (*(char *)&p_Var9->_M_next != '\0')) &&
           (*(char *)&p_Var9->_M_next != '\n')) {
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_1a8,(char *)local_1d0[5]._M_next,(long)local_1d0[5]._M_prev);
        }
        p_Var11 = p_Var9;
        cVar4 = local_1d1;
        cVar6 = *(char *)&p_Var9->_M_next;
      }
      local_1d1 = cVar4;
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,(char *)local_1d0[7]._M_next,(long)local_1d0[7]._M_prev);
      pcVar10 = "|||\n";
    }
    else if (iVar1 == 0xe) {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\'",1);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,(char *)local_1d0[3]._M_next,(long)local_1d0[3]._M_prev);
      lVar8 = 2;
      pcVar10 = "\'\n";
    }
    else if (iVar1 == 0xd) {
      std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"\"",1);
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,(char *)local_1d0[3]._M_next,(long)local_1d0[3]._M_prev);
      lVar8 = 2;
      pcVar10 = "\"\n";
    }
    else {
      poVar7 = std::__ostream_insert<char,std::char_traits<char>>
                         (local_1a8,(char *)local_1d0[3]._M_next,(long)local_1d0[3]._M_prev);
      lVar8 = 1;
      pcVar10 = "\n";
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar7,pcVar10,lVar8);
    tokens = (Tokens *)local_1d0;
  } while (iVar1 != 0x24);
  psVar5 = local_1c8;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return psVar5;
}

Assistant:

std::string jsonnet_unlex(const Tokens &tokens)
{
    std::stringstream ss;
    for (const auto &t : tokens) {
        for (const auto &f : t.fodder) {
            switch (f.kind) {
                case FodderElement::LINE_END: {
                    if (f.comment.size() > 0) {
                        ss << "LineEnd(" << f.blanks << ", " << f.indent << ", " << f.comment[0]
                           << ")\n";
                    } else {
                        ss << "LineEnd(" << f.blanks << ", " << f.indent << ")\n";
                    }
                } break;

                case FodderElement::INTERSTITIAL: {
                    ss << "Interstitial(" << f.comment[0] << ")\n";
                } break;

                case FodderElement::PARAGRAPH: {
                    ss << "Paragraph(\n";
                    for (const auto &line : f.comment) {
                        ss << "    " << line << '\n';
                    }
                    ss << ")" << f.blanks << "\n";
                } break;
            }
        }
        if (t.kind == Token::END_OF_FILE) {
            ss << "EOF\n";
            break;
        }
        if (t.kind == Token::STRING_DOUBLE) {
            ss << "\"" << t.data << "\"\n";
        } else if (t.kind == Token::STRING_SINGLE) {
            ss << "'" << t.data << "'\n";
        } else if (t.kind == Token::STRING_BLOCK) {
            ss << "|||\n";
            ss << t.stringBlockIndent;
            for (const char *cp = t.data.c_str(); *cp != '\0'; ++cp) {
                ss << *cp;
                if (*cp == '\n' && *(cp + 1) != '\n' && *(cp + 1) != '\0') {
                    ss << t.stringBlockIndent;
                }
            }
            ss << t.stringBlockTermIndent << "|||\n";
        } else {
            ss << t.data << "\n";
        }
    }
    return ss.str();
}